

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legendre.h
# Opt level: O2

float legendre_total(vec3 *pos,float *coefficients)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar1 = *coefficients;
  fVar14 = (pos->field_0).field_0.y;
  fVar12 = fVar14 * legendre_1_scalar;
  fVar2 = coefficients[1];
  fVar3 = (pos->field_0).field_0.x;
  fVar4 = (pos->field_0).field_0.z;
  fVar17 = fVar3 * legendre_1_scalar;
  fVar16 = legendre_1_scalar * fVar4;
  fVar5 = coefficients[2];
  fVar6 = coefficients[3];
  fVar14 = fVar14 * legendre_2_scalar;
  fVar7 = coefficients[4];
  fVar8 = coefficients[5];
  fVar15 = (fVar4 * 3.0 * fVar4 + -1.0) * legendre_2_zz_scalar;
  fVar9 = coefficients[6];
  fVar13 = fVar4 * legendre_2_scalar;
  fVar10 = coefficients[7];
  fVar11 = legendre_2_4(pos);
  return fVar11 * coefficients[8] +
         ((fVar15 * fVar9 +
          ((fVar3 * fVar14 * fVar7 +
           ((fVar16 * fVar5 + (fVar1 * 0.15915494 - fVar12 * fVar2)) - fVar17 * fVar6)) -
          fVar14 * fVar4 * fVar8)) - fVar13 * fVar3 * fVar10);
}

Assistant:

inline float legendre_total(const glm::vec3 &pos, float *coefficients) {
    float total_scalar = legendre_0_0(pos) * coefficients[0] +
                         legendre_1_0(pos) * coefficients[1] +
                         legendre_1_1(pos) * coefficients[2] +
                         legendre_1_2(pos) * coefficients[3] +
                         legendre_2_0(pos) * coefficients[4] +
                         legendre_2_1(pos) * coefficients[5] +
                         legendre_2_2(pos) * coefficients[6] +
                         legendre_2_3(pos) * coefficients[7] +
                         legendre_2_4(pos) * coefficients[8];
    return total_scalar;
}